

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

optional_ptr<duckdb::CopyToFileInfo,_true> __thiscall
duckdb::CopyToFunctionGlobalState::AddFile
          (CopyToFunctionGlobalState *this,StorageLockKey *l,string *file_name,
          CopyFunctionReturnType return_type)

{
  _Head_base<0UL,_duckdb::CopyFunctionFileStatistics_*,_false> __p;
  pointer pCVar1;
  undefined3 in_register_00000009;
  templated_unique_single_t file_info;
  _Head_base<0UL,_duckdb::CopyToFileInfo_*,_false> local_28;
  _Head_base<0UL,_duckdb::CopyFunctionFileStatistics_*,_false> local_20;
  
  make_uniq<duckdb::CopyToFileInfo,std::__cxx11::string_const&>((duckdb *)&local_28,file_name);
  if (CONCAT31(in_register_00000009,return_type) == 2) {
    make_uniq<duckdb::CopyFunctionFileStatistics>();
    pCVar1 = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>::
             operator->((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                         *)&local_28);
    __p._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
    ::reset((__uniq_ptr_impl<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
             *)&pCVar1->file_stats,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
    ::~unique_ptr((unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
                   *)&local_20);
  }
  else {
    local_28._M_head_impl = (CopyToFileInfo *)0x0;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>
            ((vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>>
              *)&this->written_files,
             (unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
              *)&local_28);
  ::std::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>_> *)
              &local_28);
  return (optional_ptr<duckdb::CopyToFileInfo,_true>)local_28._M_head_impl;
}

Assistant:

optional_ptr<CopyToFileInfo> AddFile(const StorageLockKey &l, const string &file_name,
	                                     CopyFunctionReturnType return_type) {
		D_ASSERT(l.GetType() == StorageLockType::EXCLUSIVE);
		auto file_info = make_uniq<CopyToFileInfo>(file_name);
		optional_ptr<CopyToFileInfo> result;
		if (return_type == CopyFunctionReturnType::WRITTEN_FILE_STATISTICS) {
			file_info->file_stats = make_uniq<CopyFunctionFileStatistics>();
			result = file_info.get();
		}
		written_files.push_back(std::move(file_info));
		return result;
	}